

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::type_caster_generic::load
          (type_caster_generic *this,handle src,bool convert,PyTypeObject *tobj)

{
  handle hVar1;
  pointer ppVar2;
  pointer pp_Var3;
  pointer pp_Var4;
  pointer pp_Var5;
  unsigned_long uVar6;
  bool bVar7;
  int iVar8;
  internals *piVar9;
  const_iterator cVar10;
  type_info *ptVar11;
  void *pvVar12;
  pointer ppVar13;
  object *this_00;
  pointer pp_Var14;
  _func__object_ptr__object_ptr__typeobject_ptr **converter;
  pointer pp_Var15;
  iterator __begin4;
  tuple parents;
  iterator __end4;
  undefined1 local_68 [24];
  object local_50;
  iterator local_48;
  
  ptVar11 = this->typeinfo;
  if (ptVar11 == (type_info *)0x0 || src.m_ptr == (PyObject *)0x0) {
    return false;
  }
  if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
    this->value = (void *)0x0;
    return true;
  }
  if (ptVar11->simple_type == true) {
    iVar8 = PyType_IsSubtype(tobj);
    if (iVar8 != 0) {
LAB_0011db4b:
      this->value = (void *)src.m_ptr[1].ob_refcnt;
      return true;
    }
  }
  else {
    if (ptVar11->type == tobj) goto LAB_0011db4b;
    piVar9 = get_internals();
    uVar6 = ((tobj->ob_base).ob_base.ob_type)->tp_flags;
    local_68._0_8_ = tobj;
    cVar10 = std::
             _Hashtable<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(piVar9->registered_types_py)._M_h,(key_type *)local_68);
    if ((((int)uVar6 < 0) &&
        (cVar10.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur ==
         (__node_type *)0x0)) && (hVar1.m_ptr = tobj->tp_bases, hVar1.m_ptr != (PyObject *)0x0)) {
      (hVar1.m_ptr)->ob_refcnt = (hVar1.m_ptr)->ob_refcnt + 1;
      local_50.super_handle.m_ptr = (handle)(handle)hVar1.m_ptr;
      local_68._0_8_ = PyObject_GetIter();
      local_68[0x10] = false;
      local_68._8_8_ = (PyObject *)0x0;
      local_48.ready = false;
      local_48.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_48.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
      while (bVar7 = iterator::operator!=((iterator *)local_68,&local_48), bVar7) {
        if ((local_68[0x10] == false) && ((PyTypeObject *)local_68._0_8_ != (PyTypeObject *)0x0)) {
          iterator::advance((iterator *)local_68);
          local_68[0x10] = true;
        }
        bVar7 = load(this,src,convert,(PyTypeObject *)local_68._8_8_);
        if (bVar7) {
          object::~object(&local_48.value);
          object::~object(&local_48.super_object);
          object::~object((object *)(local_68 + 8));
          object::~object((object *)local_68);
          this_00 = &local_50;
          goto LAB_0011dcbb;
        }
        if ((PyTypeObject *)local_68._0_8_ != (PyTypeObject *)0x0) {
          iterator::advance((iterator *)local_68);
        }
      }
      object::~object(&local_48.value);
      object::~object(&local_48.super_object);
      object::~object((object *)(local_68 + 8));
      object::~object((object *)local_68);
      object::~object(&local_50);
    }
    ppVar13 = (this->typeinfo->implicit_casts).
              super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->typeinfo->implicit_casts).
             super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar13 != ppVar2) {
      do {
        type_caster_generic((type_caster_generic *)local_68,ppVar13->first);
        bVar7 = load((type_caster_generic *)local_68,src,convert);
        if (bVar7) {
          pvVar12 = (*ppVar13->second)((void *)local_68._8_8_);
          this->value = pvVar12;
          this_00 = (object *)(local_68 + 0x10);
LAB_0011dcbb:
          object::~object(this_00);
          return true;
        }
        object::~object((object *)(local_68 + 0x10));
        ppVar13 = ppVar13 + 1;
      } while (ppVar13 != ppVar2);
    }
  }
  if (convert) {
    ptVar11 = this->typeinfo;
    pp_Var15 = (ptVar11->implicit_conversions).
               super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pp_Var3 = (ptVar11->implicit_conversions).
              super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pp_Var15 != pp_Var3) {
      do {
        local_68._0_8_ = (**pp_Var15)(src.m_ptr,this->typeinfo->type);
        object::operator=(&this->temp,(object *)local_68);
        object::~object((object *)local_68);
        bVar7 = load(this,(this->temp).super_handle.m_ptr,false);
        if (bVar7) {
          return true;
        }
        pp_Var15 = pp_Var15 + 1;
      } while (pp_Var15 != pp_Var3);
      ptVar11 = this->typeinfo;
    }
    pp_Var4 = (ptVar11->direct_conversions->
              super__Vector_base<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pp_Var5 = (ptVar11->direct_conversions->
              super__Vector_base<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pp_Var4 != pp_Var5) {
      do {
        pp_Var14 = pp_Var4 + 1;
        bVar7 = (**pp_Var4)(src.m_ptr,&this->value);
        if (bVar7) {
          return bVar7;
        }
        pp_Var4 = pp_Var14;
      } while (pp_Var14 != pp_Var5);
      return bVar7;
    }
  }
  return false;
}

Assistant:

bool load(handle src, bool convert, PyTypeObject *tobj) {
        if (!src || !typeinfo)
            return false;
        if (src.is_none()) {
            value = nullptr;
            return true;
        }

        if (typeinfo->simple_type) { /* Case 1: no multiple inheritance etc. involved */
            /* Check if we can safely perform a reinterpret-style cast */
            if (PyType_IsSubtype(tobj, typeinfo->type)) {
                value = reinterpret_cast<instance<void> *>(src.ptr())->value;
                return true;
            }
        } else { /* Case 2: multiple inheritance */
            /* Check if we can safely perform a reinterpret-style cast */
            if (tobj == typeinfo->type) {
                value = reinterpret_cast<instance<void> *>(src.ptr())->value;
                return true;
            }

            /* If this is a python class, also check the parents recursively */
            auto const &type_dict = get_internals().registered_types_py;
            bool new_style_class = PyType_Check((PyObject *) tobj);
            if (type_dict.find(tobj) == type_dict.end() && new_style_class && tobj->tp_bases) {
                auto parents = reinterpret_borrow<tuple>(tobj->tp_bases);
                for (handle parent : parents) {
                    bool result = load(src, convert, (PyTypeObject *) parent.ptr());
                    if (result)
                        return true;
                }
            }

            /* Try implicit casts */
            for (auto &cast : typeinfo->implicit_casts) {
                type_caster_generic sub_caster(*cast.first);
                if (sub_caster.load(src, convert)) {
                    value = cast.second(sub_caster.value);
                    return true;
                }
            }
        }

        /* Perform an implicit conversion */
        if (convert) {
            for (auto &converter : typeinfo->implicit_conversions) {
                temp = reinterpret_steal<object>(converter(src.ptr(), typeinfo->type));
                if (load(temp, false))
                    return true;
            }
            for (auto &converter : *typeinfo->direct_conversions) {
                if (converter(src.ptr(), value))
                    return true;
            }
        }
        return false;
    }